

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

void Abc_ManResubCollectDivs_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vInternal)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  void **ppvVar5;
  int in_EDX;
  int Fill;
  int iVar6;
  
  pAVar3 = pNode->pNtk;
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,in_EDX);
  if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pNode->pNtk;
  iVar1 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar6] == iVar1) {
    return;
  }
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar6 + 1,Fill);
  if (((long)iVar6 < 0) || ((pAVar4->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar4->vTravIds).pArray[iVar6] = iVar1;
  Abc_ManResubCollectDivs_rec
            ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vInternal);
  Abc_ManResubCollectDivs_rec
            ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vInternal);
  if ((pNode->field_0x14 & 0x10) != 0) {
    return;
  }
  uVar2 = vInternal->nCap;
  if (vInternal->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vInternal->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vInternal->pArray,0x80);
      }
      vInternal->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_00301c02;
      if (vInternal->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vInternal->pArray,(ulong)uVar2 << 4);
      }
      vInternal->pArray = ppvVar5;
    }
    vInternal->nCap = iVar6;
  }
LAB_00301c02:
  iVar6 = vInternal->nSize;
  vInternal->nSize = iVar6 + 1;
  vInternal->pArray[iVar6] = pNode;
  return;
}

Assistant:

void Abc_ManResubCollectDivs_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vInternal )
{
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // collect the fanins
    Abc_ManResubCollectDivs_rec( Abc_ObjFanin0(pNode), vInternal );
    Abc_ManResubCollectDivs_rec( Abc_ObjFanin1(pNode), vInternal );
    // collect the internal node
    if ( pNode->fMarkA == 0 ) 
        Vec_PtrPush( vInternal, pNode );
}